

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O0

uint CalculateNextWorkRequired(CBlockIndex *pindexLast,int64_t nFirstBlockTime,Params *params)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  int64_t iVar4;
  CBlockIndex *this;
  CBlockIndex *this_00;
  arith_uint256 *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindexFirst;
  int nHeightFirst;
  int64_t nActualTimespan;
  arith_uint256 bnNew;
  arith_uint256 bnPowLimit;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  base_uint<256U> *in_stack_ffffffffffffff50;
  CBlockIndex *in_stack_ffffffffffffff60;
  undefined1 fNegative;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  base_uint<256U> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)in_RDX[7].super_base_uint<256U>.pn + 0x1a) & 1) == 0) {
    iVar4 = CBlockIndex::GetBlockTime
                      ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
    ;
    this = (CBlockIndex *)(iVar4 - in_RSI);
    this_00 = this;
    if ((long)this < *(long *)(in_RDX[8].super_base_uint<256U>.pn + 2) / 4) {
      this_00 = (CBlockIndex *)(*(long *)(in_RDX[8].super_base_uint<256U>.pn + 2) / 4);
    }
    if (*(long *)(in_RDX[8].super_base_uint<256U>.pn + 2) * 4 < (long)this_00) {
      this_00 = (CBlockIndex *)(*(long *)(in_RDX[8].super_base_uint<256U>.pn + 2) << 2);
    }
    UintToArith256((uint256 *)in_stack_ffffffffffffff60);
    arith_uint256::arith_uint256
              ((arith_uint256 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if ((*(byte *)((long)in_RDX[7].super_base_uint<256U>.pn + 0x19) & 1) == 0) {
      arith_uint256::SetCompact
                (in_RDX,(uint32_t)((ulong)this_00 >> 0x20),
                 (bool *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (bool *)in_stack_ffffffffffffff60);
    }
    else {
      in_stack_ffffffffffffff50 = (base_uint<256U> *)(long)*(int *)(in_RDI + 0x18);
      iVar4 = Consensus::Params::DifficultyAdjustmentInterval
                        ((Params *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_stack_ffffffffffffff6c = (int)in_stack_ffffffffffffff50 - ((int)iVar4 + -1);
      in_stack_ffffffffffffff60 = CBlockIndex::GetAncestor(this_00,in_stack_ffffffffffffff6c);
      arith_uint256::SetCompact
                (in_RDX,(uint32_t)((ulong)this_00 >> 0x20),
                 (bool *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (bool *)in_stack_ffffffffffffff60);
    }
    base_uint<256U>::operator*=
              ((base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    fNegative = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
    base_uint<256U>::base_uint((base_uint<256U> *)this,(uint64_t)in_stack_ffffffffffffff50);
    base_uint<256U>::operator/=
              (in_stack_ffffffffffffff98,
               (base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar2 = operator>((base_uint<256U> *)this,in_stack_ffffffffffffff50);
    if (bVar2) {
      arith_uint256::operator=((arith_uint256 *)this,(arith_uint256 *)in_stack_ffffffffffffff50);
    }
    uVar3 = arith_uint256::GetCompact
                      ((arith_uint256 *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(bool)fNegative
                      );
  }
  else {
    uVar3 = *(uint32_t *)(in_RDI + 0x84);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

unsigned int CalculateNextWorkRequired(const CBlockIndex* pindexLast, int64_t nFirstBlockTime, const Consensus::Params& params)
{
    if (params.fPowNoRetargeting)
        return pindexLast->nBits;

    // Limit adjustment step
    int64_t nActualTimespan = pindexLast->GetBlockTime() - nFirstBlockTime;
    if (nActualTimespan < params.nPowTargetTimespan/4)
        nActualTimespan = params.nPowTargetTimespan/4;
    if (nActualTimespan > params.nPowTargetTimespan*4)
        nActualTimespan = params.nPowTargetTimespan*4;

    // Retarget
    const arith_uint256 bnPowLimit = UintToArith256(params.powLimit);
    arith_uint256 bnNew;

    // Special difficulty rule for Testnet4
    if (params.enforce_BIP94) {
        // Here we use the first block of the difficulty period. This way
        // the real difficulty is always preserved in the first block as
        // it is not allowed to use the min-difficulty exception.
        int nHeightFirst = pindexLast->nHeight - (params.DifficultyAdjustmentInterval()-1);
        const CBlockIndex* pindexFirst = pindexLast->GetAncestor(nHeightFirst);
        bnNew.SetCompact(pindexFirst->nBits);
    } else {
        bnNew.SetCompact(pindexLast->nBits);
    }

    bnNew *= nActualTimespan;
    bnNew /= params.nPowTargetTimespan;

    if (bnNew > bnPowLimit)
        bnNew = bnPowLimit;

    return bnNew.GetCompact();
}